

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agency.c
# Opt level: O0

feed_db_status_t store_agency_db(agency_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char local_d8 [8];
  char qr [169];
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  agency_t *record_local;
  
  memcpy(local_d8,
         "INSERT INTO agency (agency_id, agency_name,agency_url, agency_timezone,agency_lang, agency_phone,agency_fare_url, agency_email) values (?1, ?2, ?3, ?4, ?5, ?6, ?7, ?8);"
         ,0xa9);
  sqlite3_prepare_v2(db->conn,local_d8,-1,(sqlite3_stmt **)(qr + 0xa8),(char **)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,1,record->id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,2,record->name,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,3,record->url,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,4,record->timezone,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,5,record->lang,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,6,record->phone,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,7,record->fare_url,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,8,record->email,-1,(_func_void_void_ptr *)0x0);
  iVar1 = sqlite3_step(stack0xffffffffffffffd8);
  db->rc = iVar1;
  bVar3 = db->rc == 0x65;
  if (bVar3) {
    sqlite3_finalize(stack0xffffffffffffffd8);
  }
  else {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
    sqlite3_finalize(stack0xffffffffffffffd8);
  }
  record_local._4_4_ = (feed_db_status_t)bVar3;
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_agency_db(agency_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO agency ("
                    "agency_id, agency_name,"
                    "agency_url, agency_timezone,"
                    "agency_lang, agency_phone,"
                    "agency_fare_url, agency_email"
                ") values ("
                    "?1, ?2, ?3, ?4, ?5, ?6, ?7, ?8"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->name, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 3, record->url, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 4, record->timezone, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 5, record->lang, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 6, record->phone, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 7, record->fare_url, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 8, record->email, -1, SQLITE_STATIC);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}